

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

string * re2::DFA::DumpWorkq_abi_cxx11_(Workq *q)

{
  bool bVar1;
  SparseSetT<void> *pSVar2;
  Workq *in_RSI;
  string *in_RDI;
  iterator it;
  char *sep;
  string *s;
  SparseSetT<void> *pSVar3;
  string local_58 [48];
  SparseSetT<void> *local_28;
  char *local_20;
  undefined1 local_11;
  Workq *local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)in_RDI);
  local_20 = anon_var_dwarf_2a2f8f + 0x11;
  local_28 = (SparseSetT<void> *)SparseSetT<void>::begin((SparseSetT<void> *)0x246751);
  while (pSVar3 = local_28, pSVar2 = (SparseSetT<void> *)SparseSetT<void>::end(local_28),
        pSVar3 != pSVar2) {
    bVar1 = Workq::is_mark(local_10,local_28->size_);
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)in_RDI,"|");
      local_20 = anon_var_dwarf_2a2f8f + 0x11;
    }
    else {
      StringPrintf_abi_cxx11_((char *)local_58,"%s%d",local_20,(ulong)(uint)local_28->size_);
      std::__cxx11::string::operator+=((string *)in_RDI,local_58);
      std::__cxx11::string::~string(local_58);
      local_20 = ",";
    }
    local_28 = (SparseSetT<void> *)&local_28->field_0x4;
  }
  return in_RDI;
}

Assistant:

std::string DFA::DumpWorkq(Workq* q) {
  std::string s;
  const char* sep = "";
  for (Workq::iterator it = q->begin(); it != q->end(); ++it) {
    if (q->is_mark(*it)) {
      s += "|";
      sep = "";
    } else {
      s += StringPrintf("%s%d", sep, *it);
      sep = ",";
    }
  }
  return s;
}